

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::indexInstruction(SelectionEvaluator *this,any *value)

{
  bool bVar1;
  int iVar2;
  pair<int,_int> pVar3;
  size_t sVar4;
  undefined8 in_RSI;
  SelectionEvaluator *in_RDI;
  SelectionEvaluator *in_stack_00000008;
  pair<int,_int> in_stack_00000010;
  pair<int,_int> indexRange;
  int index;
  SelectionSet bs;
  any *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  IndexFinder *in_stack_ffffffffffffff38;
  type_info *in_stack_ffffffffffffff40;
  IndexFinder *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff8c;
  SelectionEvaluator *in_stack_ffffffffffffff90;
  int local_68;
  int iStack_64;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_30 [2];
  
  createSelectionSets(in_RDI);
  std::any::type((any *)in_stack_ffffffffffffff38);
  bVar1 = std::type_info::operator==
                    (in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38);
  if (bVar1) {
    iVar2 = std::any_cast<int>((any *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
    ;
    if (-1 < iVar2) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (local_30,0);
      sVar4 = OpenMDBitSet::size((OpenMDBitSet *)0x3c6bd7);
      if (iVar2 < (int)sVar4) {
        IndexFinder::find(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
        SelectionSet::operator=
                  ((SelectionSet *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (SelectionSet *)in_stack_ffffffffffffff28);
        SelectionSet::~SelectionSet((SelectionSet *)0x3c6c61);
        goto LAB_003c6d42;
      }
    }
    invalidIndex(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  else {
    std::any::type((any *)in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      (in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38);
    if (bVar1) {
      pVar3 = std::any_cast<std::pair<int,int>>(in_stack_ffffffffffffff28);
      local_68 = pVar3.first;
      if (-1 < local_68) {
        iStack_64 = pVar3.second;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                  (local_30,0);
        sVar4 = OpenMDBitSet::size((OpenMDBitSet *)0x3c6cd1);
        if (iStack_64 < (int)sVar4) {
          IndexFinder::find(in_stack_ffffffffffffff78,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
          SelectionSet::operator=
                    ((SelectionSet *)CONCAT44(iStack_64,in_stack_ffffffffffffff30),
                     (SelectionSet *)in_stack_ffffffffffffff28);
          SelectionSet::~SelectionSet((SelectionSet *)0x3c6d3e);
          goto LAB_003c6d42;
        }
      }
      invalidIndexRange(in_stack_00000008,in_stack_00000010);
    }
  }
LAB_003c6d42:
  SelectionSet::parallelReduce((SelectionSet *)in_stack_ffffffffffffff78);
  SelectionSet::~SelectionSet((SelectionSet *)0x3c6d63);
  return (SelectionSet *)in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::indexInstruction(const std::any& value) {
    SelectionSet bs = createSelectionSets();

    if (value.type() == typeid(int)) {
      int index = std::any_cast<int>(value);
      if (index < 0 ||
          index >= static_cast<int>(bs.bitsets_[STUNTDOUBLE].size())) {
        invalidIndex(index);
      } else {
        bs = indexFinder.find(index);
      }
    } else if (value.type() == typeid(std::pair<int, int>)) {
      std::pair<int, int> indexRange =
          std::any_cast<std::pair<int, int>>(value);
      assert(indexRange.first <= indexRange.second);
      if (indexRange.first < 0 ||
          indexRange.second >=
              static_cast<int>(bs.bitsets_[STUNTDOUBLE].size())) {
        invalidIndexRange(indexRange);
      } else {
        bs = indexFinder.find(indexRange.first, indexRange.second);
      }
    }

    return bs.parallelReduce();
  }